

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_strings.hpp
# Opt level: O1

char * __thiscall
ELFIO::string_section_accessor_template<ELFIO::section>::get_string
          (string_section_accessor_template<ELFIO::section> *this,Elf_Word index)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar5;
  void *pvVar6;
  char *__s;
  long lVar4;
  undefined4 extraout_var_00;
  
  if (this->string_section != (section *)0x0) {
    uVar1 = (ulong)index;
    iVar3 = (*this->string_section->_vptr_section[0x18])();
    lVar4 = CONCAT44(extraout_var,iVar3);
    iVar3 = (*this->string_section->_vptr_section[0x13])();
    uVar5 = CONCAT44(extraout_var_00,iVar3);
    if (lVar4 == 0 || (uVar5 < uVar1 || uVar5 - uVar1 == 0)) {
      bVar2 = false;
      __s = (char *)0x0;
    }
    else {
      __s = (char *)(uVar1 + lVar4);
      pvVar6 = memchr(__s,0,uVar5 - uVar1);
      bVar2 = (void *)(uVar5 + lVar4) <= pvVar6 || pvVar6 == (void *)0x0;
    }
    if (!bVar2) {
      return __s;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* get_string( Elf_Word index ) const
    {
        if ( string_section ) {
            const char* data = string_section->get_data();
            size_t      section_size =
                static_cast<size_t>( string_section->get_size() );

            // Check if index is within bounds
            if ( index >= section_size || nullptr == data ) {
                return nullptr;
            }

            // Check for integer overflow in size calculation
            size_t remaining_size = section_size - index;
            if ( remaining_size > section_size ) { // Check for underflow
                return nullptr;
            }

            // Use standard C++ functions to find string length
            const char* str = data + index;
            const char* end =
                (const char*)std::memchr( str, '\0', remaining_size );
            if ( end != nullptr && end < str + remaining_size ) {
                return str;
            }
        }

        return nullptr;
    }